

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall
TPZVec<TPZGeoNode_*>::Fill
          (TPZVec<TPZGeoNode_*> *this,TPZGeoNode **copy,int64_t from,int64_t numelem)

{
  long lVar1;
  int64_t i;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  
  if (numelem < -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZVec::Fill");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<(poVar2,"It\'s negative parameter numelem, then numelem = ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  lVar3 = 0;
  if (0 < from) {
    lVar3 = from;
  }
  lVar1 = this->fNElements;
  if (lVar1 <= lVar3) {
    lVar3 = lVar1;
  }
  if (numelem < 0) {
    numelem = lVar1;
  }
  lVar4 = numelem + from;
  if (lVar1 <= numelem + from) {
    lVar4 = lVar1;
  }
  for (; lVar3 < lVar4; lVar3 = lVar3 + 1) {
    this->fStore[lVar3] = *copy;
  }
  return;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}